

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::GenerateRegionSyntax::setChild
          (GenerateRegionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  SyntaxList<slang::syntax::MemberSyntax> *pSVar3;
  logic_error *this_00;
  Token TVar4;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  GenerateRegionSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_MemberSyntax).attributes,pSVar1);
    break;
  case 1:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar4._0_8_;
    (this->keyword).kind = (undefined2)local_28;
    (this->keyword).field_0x2 = local_28._2_1_;
    (this->keyword).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->keyword).rawLen = local_28._4_4_;
    local_20 = TVar4.info;
    (this->keyword).info = local_20;
    break;
  case 2:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar3 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::MemberSyntax>>(pSVar2);
    SyntaxList<slang::syntax::MemberSyntax>::operator=(&this->members,pSVar3);
    break;
  case 3:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar4._0_8_;
    (this->endgenerate).kind = (undefined2)local_38;
    (this->endgenerate).field_0x2 = local_38._2_1_;
    (this->endgenerate).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->endgenerate).rawLen = local_38._4_4_;
    local_30 = TVar4.info;
    (this->endgenerate).info = local_30;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_d9);
    std::operator+(&local_b8,&local_d8,":");
    std::__cxx11::to_string(&local_110,0x1999);
    std::operator+(&local_98,&local_b8,&local_110);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_58);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void GenerateRegionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 3: endgenerate = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}